

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

bool __thiscall utf8stream::seek(utf8stream *this,offset off,int whence)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  uchar skip [512];
  undefined1 auStack_238 [520];
  
  if ((this->writing == false) && (this->reading == true)) {
    if (whence == 1) {
      off = off + this->pos;
    }
    else if (whence == 2) {
      do {
        iVar1 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,0x200);
      } while (iVar1 == 0x200);
      return off == 0;
    }
    uVar3 = off - this->pos;
    if (off < this->pos) {
      if (off < 0) goto LAB_0015b035;
      iVar1 = (*this->file->_vptr_stream[6])(this->file,0,0);
      if ((char)iVar1 == '\0') {
        return false;
      }
      this->pos = 0;
      this->bufread = 0;
      this->bufcarry = 0;
      this->buflen = 0;
      checkheader(this);
      uVar3 = off;
    }
    do {
      bVar4 = (long)uVar3 < 1;
      if ((long)uVar3 < 1) {
        return bVar4;
      }
      uVar2 = 0x200;
      if ((long)uVar3 < 0x200) {
        uVar2 = uVar3;
      }
      iVar1 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,uVar2 & 0xffffffff);
      if (iVar1 == (int)uVar2) {
        uVar3 = uVar3 - uVar2;
      }
      else if (this->reading == true) {
        this->reading = false;
      }
    } while (iVar1 == (int)uVar2);
  }
  else {
LAB_0015b035:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool seek(offset off, int whence)
    {
        if(writing || !reading) return false;

        if(whence == SEEK_END)
        {
            uchar skip[512];
            while(read(skip, sizeof(skip)) == sizeof(skip));
            return !off;
        }
        else if(whence == SEEK_CUR) off += pos;

        if(off >= pos) off -= pos;
        else if(off < 0 || !file->seek(0, SEEK_SET)) return false;
        else
        {
            bufread = bufcarry = buflen = 0;
            pos = 0;
            checkheader();
        }

        uchar skip[512];
        while(off > 0)
        {
            int skipped = (int)min(off, (offset)sizeof(skip));
            if(read(skip, skipped) != skipped) { stopreading(); return false; }
            off -= skipped;
        }

        return true;
    }